

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser::note(Parser *this,char *msg)

{
  long lVar1;
  long in_RSI;
  Symbol *in_RDI;
  long in_FS_OFFSET;
  undefined1 in_stack_00000020 [16];
  QByteArrayView in_stack_00000030;
  Symbol *in_stack_ffffffffffffff88;
  Symbol *data;
  QByteArrayView *in_stack_ffffffffffffffa0;
  Symbol *in_stack_ffffffffffffffc0;
  Parser *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_RDI->from & 0x100) != 0) && (in_RSI != 0)) {
    data = in_RDI;
    QByteArrayView::QByteArrayView<10ul>(in_stack_ffffffffffffffa0,(char (*) [10])in_RDI);
    QByteArrayView::QByteArrayView<const_char_*,_true>(in_stack_ffffffffffffffa0,(char **)data);
    if ((in_RDI->lex).d.size < 1) {
      memset(&stack0xffffffffffffffa0,0,0x30);
      Symbol::Symbol(in_RDI);
    }
    else {
      symbol((Parser *)0x164f46);
      Symbol::Symbol(in_RDI,in_stack_ffffffffffffff88);
    }
    printMsg(in_stack_ffffffffffffffc8,in_stack_00000030,(QByteArrayView)in_stack_00000020,
             in_stack_ffffffffffffffc0);
    Symbol::~Symbol((Symbol *)0x164f9d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Parser::note(const char *msg) {
    if (displayNotes && msg)
        printMsg("note: %s\n", msg, index > 0 ? symbol() : Symbol{});
}